

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAParameters.cpp
# Opt level: O3

ByteString * __thiscall
DSAParameters::serialise(ByteString *__return_storage_ptr__,DSAParameters *this)

{
  ByteString local_b0;
  ByteString local_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_60,&this->p);
  ByteString::serialise(&local_88,&this->q);
  operator+(&local_38,&local_60,&local_88);
  ByteString::serialise(&local_b0,&this->g);
  operator+(__return_storage_ptr__,&local_38,&local_b0);
  local_b0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_b0.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_88._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_88.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_60._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_60.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ByteString DSAParameters::serialise() const
{
	return p.serialise() + q.serialise() + g.serialise();
}